

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O1

void __thiscall crnlib::command_line_params::clear(command_line_params *this)

{
  dynamic_string *pdVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  pdVar1 = (this->m_params).m_p;
  if (pdVar1 != (dynamic_string *)0x0) {
    uVar4 = (ulong)(this->m_params).m_size;
    if (uVar4 != 0) {
      lVar3 = 0;
      do {
        lVar2 = *(long *)((long)&pdVar1->m_pStr + lVar3);
        if ((lVar2 != 0) && ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff)) {
          crnlib_free((void *)(lVar2 + -0x10));
        }
        lVar3 = lVar3 + 0x10;
      } while (uVar4 << 4 != lVar3);
    }
    crnlib_free((this->m_params).m_p);
    (this->m_params).m_p = (dynamic_string *)0x0;
    (this->m_params).m_size = 0;
    (this->m_params).m_capacity = 0;
  }
  std::
  _Rb_tree<crnlib::dynamic_string,_std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>,_std::_Select1st<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
  ::clear(&(this->m_param_map)._M_t);
  return;
}

Assistant:

void command_line_params::clear() {
  m_params.clear();

  m_param_map.clear();
}